

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvreader.cc
# Opt level: O2

bool __thiscall mkvparser::MkvReader::GetFileSize(MkvReader *this)

{
  long lVar1;
  bool bVar2;
  
  bVar2 = false;
  if ((FILE *)this->m_file != (FILE *)0x0) {
    fseek((FILE *)this->m_file,0,2);
    lVar1 = ftell((FILE *)this->m_file);
    this->m_length = lVar1;
    bVar2 = false;
    if (-1 < lVar1) {
      fseek((FILE *)this->m_file,0,0);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool MkvReader::GetFileSize() {
  if (m_file == NULL)
    return false;
#ifdef _MSC_VER
  int status = _fseeki64(m_file, 0L, SEEK_END);

  if (status)
    return false;  // error

  m_length = _ftelli64(m_file);
#else
  fseek(m_file, 0L, SEEK_END);
  m_length = ftell(m_file);
#endif
  assert(m_length >= 0);

  if (m_length < 0)
    return false;

#ifdef _MSC_VER
  status = _fseeki64(m_file, 0L, SEEK_SET);

  if (status)
    return false;  // error
#else
  fseek(m_file, 0L, SEEK_SET);
#endif

  return true;
}